

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O3

void __thiscall SEIUnit::processBlurayOffsetMetadata(SEIUnit *this)

{
  int iVar1;
  BitStreamReader *this_00;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  this_00 = &(this->super_NALUnit).bitReader;
  BitStreamReader::skipBits(this_00,8);
  iVar2 = *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_initBuffer;
  iVar3 = (*(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_buffer - iVar2) * 8 -
          (this->super_NALUnit).bitReader.m_bitLeft;
  iVar1 = iVar3 + 0x20;
  iVar3 = iVar3 + 0x27;
  if (-1 < iVar1) {
    iVar3 = iVar1;
  }
  this->metadataPtsOffset = ((iVar3 >> 3) + iVar2) - *(int *)&(this->super_NALUnit).m_nalBuffer;
  BitStreamReader::skipBits(this_00,0x18);
  BitStreamReader::skipBits(this_00,0x12);
  uVar4 = BitStreamReader::getBits(this_00,6);
  this->number_of_offset_sequences = uVar4 & 0xff;
  return;
}

Assistant:

void SEIUnit::processBlurayOffsetMetadata()
{
    bitReader.skipBits(8);
    const uint8_t* ptr = bitReader.getBuffer() + bitReader.getBitsCount() / 8;
    metadataPtsOffset = static_cast<int>(ptr - m_nalBuffer);
    bitReader.skipBits(24);  // PTS[32..30], marker_bit, PTS[29..15]
    bitReader.skipBits(18);  // marker_bit, PTS[14..0], marker_bit, reserved_for_future_use bit
    number_of_offset_sequences = bitReader.getBits<uint8_t>(6);
}